

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook_unix.c
# Opt level: O1

int funchook_unprotect_begin(funchook_t *funchook,mem_state_t *mstate,void *start,size_t len)

{
  size_t sVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  ulong __len;
  void *pvVar5;
  char *pcVar6;
  char errbuf [128];
  
  pvVar5 = (void *)((ulong)start & 0xfffffffffffff000);
  mstate->addr = pvVar5;
  __len = (long)start + (len - (long)pvVar5) + 0xfff & 0xfffffffffffff000;
  mstate->size = __len;
  iVar2 = mprotect(pvVar5,__len,(funchook_unprotect_begin_prot ^ 1) * 4 + 3);
  if (iVar2 == -1) {
    piVar3 = __errno_location();
    if (((*piVar3 == 0xd) && (funchook_unprotect_begin_prot == 0)) &&
       (iVar2 = mprotect(mstate->addr,mstate->size,3), iVar2 == 0)) {
      funchook_unprotect_begin_prot = 1;
      funchook_log(funchook,"  unprotect memory %p (size=%lu, prot=read,write) <- %p (size=%lu)\n",
                   mstate->addr,mstate->size,start,len);
      return 0;
    }
  }
  else if (iVar2 == 0) {
    pcVar6 = ",exec";
    if (funchook_unprotect_begin_prot != 0) {
      pcVar6 = "";
    }
    funchook_log(funchook,"  unprotect memory %p (size=%lu, prot=read,write%s) <- %p (size=%lu)\n",
                 mstate->addr,mstate->size,pcVar6,start,len);
    return 0;
  }
  pvVar5 = mstate->addr;
  sVar1 = mstate->size;
  pcVar6 = ",exec";
  if (funchook_unprotect_begin_prot != 0) {
    pcVar6 = "";
  }
  piVar3 = __errno_location();
  pcVar4 = strerror_r(*piVar3,errbuf,0x80);
  funchook_set_error_message
            (funchook,
             "Failed to unprotect memory %p (size=%lu, prot=read,write%s) <- %p (size=%lu, error=%s)"
             ,pvVar5,sVar1,pcVar6,start,len,pcVar4);
  return 9;
}

Assistant:

int funchook_unprotect_begin(funchook_t *funchook, mem_state_t *mstate, void *start, size_t len)
{
    static int prot = PROT_READ | PROT_WRITE | PROT_EXEC;
    char errbuf[128];
    size_t saddr = ROUND_DOWN((size_t)start, page_size);
    int rv;

    mstate->addr = (void*)saddr;
    mstate->size = len + (size_t)start - saddr;
    mstate->size = ROUND_UP(mstate->size, page_size);
    rv = mprotect(mstate->addr, mstate->size, prot);
    if (rv == 0) {
        funchook_log(funchook, "  unprotect memory %p (size=%"PRIuPTR", prot=read,write%s) <- %p (size=%"PRIuPTR")\n",
                     mstate->addr, mstate->size, (prot & PROT_EXEC) ? ",exec" : "", start, len);
        return 0;
    }
    if (rv == -1 && errno == EACCES && (prot & PROT_EXEC)) {
        rv = mprotect(mstate->addr, mstate->size, PROT_READ | PROT_WRITE);
        if (rv == 0) {
            prot = PROT_READ | PROT_WRITE;
            funchook_log(funchook, "  unprotect memory %p (size=%"PRIuPTR", prot=read,write) <- %p (size=%"PRIuPTR")\n",
                         mstate->addr, mstate->size, start, len);
            return 0;
        }
    }
    funchook_set_error_message(funchook, "Failed to unprotect memory %p (size=%"PRIuPTR", prot=read,write%s) <- %p (size=%"PRIuPTR", error=%s)",
                               mstate->addr, mstate->size, (prot & PROT_EXEC) ? ",exec" : "", start, len,
                               funchook_strerror(errno, errbuf, sizeof(errbuf)));
    return FUNCHOOK_ERROR_MEMORY_FUNCTION;
}